

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_err_t flat_file_read_row(ion_flat_file_t *flat_file,ion_fpos_t location,ion_flat_file_row_t *row
                            )

{
  int iVar1;
  size_t sVar2;
  long local_30;
  ion_fpos_t read_index;
  ion_flat_file_row_t *row_local;
  ion_fpos_t location_local;
  ion_flat_file_t *flat_file_local;
  
  local_30 = 0;
  if (((flat_file->current_loaded_region == -1) || (location < flat_file->current_loaded_region)) ||
     (flat_file->current_loaded_region + flat_file->num_in_buffer <= (location & 0xffffffffU))) {
    iVar1 = fseek((FILE *)flat_file->data_file,
                  flat_file->start_of_data + location * flat_file->row_size,0);
    if (iVar1 != 0) {
      return '\r';
    }
    sVar2 = fread(flat_file->buffer,1,1,(FILE *)flat_file->data_file);
    if (sVar2 != 1) {
      return '\a';
    }
    sVar2 = fread(flat_file->buffer + 1,(long)(flat_file->super).record.key_size,1,
                  (FILE *)flat_file->data_file);
    if (sVar2 != 1) {
      return '\a';
    }
    sVar2 = fread(flat_file->buffer + (long)(flat_file->super).record.key_size + 1,
                  (long)(flat_file->super).record.value_size,1,(FILE *)flat_file->data_file);
    if (sVar2 != 1) {
      return '\a';
    }
  }
  else {
    local_30 = location - flat_file->current_loaded_region;
  }
  row->row_status = flat_file->buffer[local_30 * flat_file->row_size];
  row->key = flat_file->buffer + local_30 * flat_file->row_size + 1;
  row->value = flat_file->buffer +
               local_30 * flat_file->row_size + 1 + (long)(flat_file->super).record.key_size;
  return '\0';
}

Assistant:

ion_err_t
flat_file_read_row(
	ion_flat_file_t		*flat_file,
	ion_fpos_t			location,
	ion_flat_file_row_t *row
) {
	ion_fpos_t read_index = 0;

	if ((flat_file->current_loaded_region != -1) && (location >= flat_file->current_loaded_region) && ((unsigned) location < flat_file->current_loaded_region + flat_file->num_in_buffer)) {
		/* Cache hit, return directly from buffer */
		read_index = location - flat_file->current_loaded_region;
	}
	else {
		/* Cache miss, have to re-read from file */
		if (0 != fseek(flat_file->data_file, flat_file->start_of_data + location * flat_file->row_size, SEEK_SET)) {
			return err_file_bad_seek;
		}

		if (1 != fread(flat_file->buffer, sizeof(row->row_status), 1, flat_file->data_file)) {
			return err_file_write_error;
		}

		if (1 != fread(flat_file->buffer + sizeof(row->row_status), flat_file->super.record.key_size, 1, flat_file->data_file)) {
			return err_file_write_error;
		}

		if (1 != fread(flat_file->buffer + sizeof(row->row_status) + flat_file->super.record.key_size, flat_file->super.record.value_size, 1, flat_file->data_file)) {
			return err_file_write_error;
		}
	}

	row->row_status = *((ion_flat_file_row_status_t *) &flat_file->buffer[read_index * flat_file->row_size]);
	row->key		= &flat_file->buffer[read_index * flat_file->row_size + sizeof(ion_flat_file_row_status_t)];
	row->value		= &flat_file->buffer[read_index * flat_file->row_size + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size];

	return err_ok;
}